

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

int __thiscall ON_wString::FindOneOf(ON_wString *this,wchar_t *character_set)

{
  wchar_t *pwVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ON_Internal_Empty_wString *pOVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  ON_UnicodeErrorParameters local_74;
  ON_wString *local_68;
  ON__UINT32 sUTF32 [2];
  wchar_t buffer [10];
  
  if ((character_set != (wchar_t *)0x0) && (*character_set != L'\0')) {
    pOVar5 = &empty_wstring;
    if (this->m_s != (wchar_t *)0x0) {
      pOVar5 = (ON_Internal_Empty_wString *)(this->m_s + -3);
    }
    if (0 < (pOVar5->header).string_length) {
      pwVar6 = character_set + -1;
      pwVar7 = pwVar6;
      do {
        pwVar7 = pwVar7 + 1;
        pwVar1 = pwVar6 + 1;
        pwVar6 = pwVar6 + 1;
      } while (*pwVar1 != L'\0');
      local_74.m_error_mask = 0xe;
      local_74.m_error_code_point = 0;
      buffer[4] = L'\0';
      buffer[5] = L'\0';
      buffer[6] = L'\0';
      buffer[7] = L'\0';
      buffer[8] = L'\0';
      buffer[9] = L'\0';
      sUTF32[0] = 0;
      sUTF32[1] = 0;
      buffer[0] = L'\0';
      buffer[1] = L'\0';
      buffer[2] = L'\0';
      buffer[3] = L'\0';
      local_68 = this;
      for (; character_set < pwVar6; character_set = character_set + uVar2) {
        local_74.m_error_status = 0;
        uVar2 = ON_DecodeWideChar(character_set,
                                  (int)((ulong)((long)pwVar7 - (long)character_set) >> 2),&local_74,
                                  sUTF32);
        if ((int)uVar2 < 1) {
          return -1;
        }
        if (sUTF32[0] == 0) {
          return -1;
        }
        if (sUTF32[1] != 0) {
          return -1;
        }
        local_74.m_error_status = 0;
        uVar3 = ON_ConvertUTF32ToWideChar
                          (0,sUTF32,1,buffer,9,&local_74.m_error_status,local_74.m_error_mask,
                           local_74.m_error_code_point,(ON__UINT32 **)0x0);
        if (uVar3 - 1 < 8 && local_74.m_error_status == 0) {
          buffer[uVar3] = L'\0';
          iVar4 = Find(local_68,buffer);
          if (-1 < iVar4) {
            return iVar4;
          }
        }
      }
    }
  }
  return -1;
}

Assistant:

int ON_wString::FindOneOf (const wchar_t* character_set) const
{
  if ( nullptr == character_set || 0 == character_set[0] || IsEmpty() )
    return -1;

  const wchar_t* s1 = character_set;
  while ( 0 != *s1 )
    s1++;

  ON_UnicodeErrorParameters e = { 0 };
  e.m_error_mask = 2 | 4 | 8;

  const wchar_t* s = character_set;
  wchar_t buffer[10] = { 0 };
  const int buffer_capacity = sizeof(buffer) / sizeof(buffer[0]) - 1;
  ON__UINT32 sUTF32[2] = { 0 };
  while (s < s1)
  {
    e.m_error_status = 0;
    int s_count = ON_DecodeWideChar(s, (int)(s1 - s), &e, &sUTF32[0]);
    if (s_count <= 0 || 0 == sUTF32[0] || 0 != sUTF32[1])
      break;
    e.m_error_status = 0;
    int buffer_count = ON_ConvertUTF32ToWideChar(
      false,
      sUTF32, 1,
      buffer, buffer_capacity,
      &e.m_error_status,
      e.m_error_mask,
      e.m_error_code_point,
      nullptr);
    if (0 == e.m_error_status && buffer_count > 0 && buffer_count < buffer_capacity)
    {
      buffer[buffer_count] = 0;
      int rc = Find(buffer);
      if (rc >= 0)
        return rc;
    }
    s += s_count;
  }
  return -1;
}